

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.cpp
# Opt level: O1

bool ValueInfo::IsEqualTo
               (Value *src1Value,int32 min1,int32 max1,Value *src2Value,int32 min2,int32 max2)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar2 = IsEqualTo_NoConverse(src1Value,min1,max1,src2Value,min2,max2);
  bVar3 = true;
  if (!bVar2) {
    bVar3 = IsEqualTo_NoConverse(src2Value,min2,max2,src1Value,min1,max1);
  }
  if (bVar3 != false) {
    bVar2 = IsNotEqualTo_NoConverse(src1Value,min1,max1,src2Value,min2,max2);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.cpp"
                         ,0xe3,
                         "(!result || !IsNotEqualTo_NoConverse(src1Value, min1, max1, src2Value, min2, max2))"
                         ,
                         "!result || !IsNotEqualTo_NoConverse(src1Value, min1, max1, src2Value, min2, max2)"
                        );
      if (!bVar2) goto LAB_00640444;
      *puVar4 = 0;
    }
    if (bVar3 != false) {
      bVar2 = IsNotEqualTo_NoConverse(src2Value,min2,max2,src1Value,min1,max1);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.cpp"
                           ,0xe4,
                           "(!result || !IsNotEqualTo_NoConverse(src2Value, min2, max2, src1Value, min1, max1))"
                           ,
                           "!result || !IsNotEqualTo_NoConverse(src2Value, min2, max2, src1Value, min1, max1)"
                          );
        if (!bVar2) {
LAB_00640444:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
  }
  return bVar3;
}

Assistant:

bool ValueInfo::IsEqualTo(
    const Value *const src1Value,
    const int32 min1,
    const int32 max1,
    const Value *const src2Value,
    const int32 min2,
    const int32 max2)
{
    const bool result =
        IsEqualTo_NoConverse(src1Value, min1, max1, src2Value, min2, max2) ||
        IsEqualTo_NoConverse(src2Value, min2, max2, src1Value, min1, max1);
    Assert(!result || !IsNotEqualTo_NoConverse(src1Value, min1, max1, src2Value, min2, max2));
    Assert(!result || !IsNotEqualTo_NoConverse(src2Value, min2, max2, src1Value, min1, max1));
    return result;
}